

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2grep.c
# Opt level: O3

void pcre2grep_exit(int rc)

{
  if (resource_error == '\x01') {
    fprintf(_stderr,"pcre2grep: Error %d, %d or %d means that a resource limit was exceeded.\n",
            0xffffffd2,0xffffffd1,0xffffffcb);
    fwrite("pcre2grep: Check your regex for nested unlimited loops.\n",0x38,1,_stderr);
  }
  exit(rc);
}

Assistant:

static void
pcre2grep_exit(int rc)
{
if (resource_error)
  {
  fprintf(stderr, "pcre2grep: Error %d, %d or %d means that a resource limit "
    "was exceeded.\n", PCRE2_ERROR_JIT_STACKLIMIT, PCRE2_ERROR_MATCHLIMIT,
    PCRE2_ERROR_RECURSIONLIMIT);
  fprintf(stderr, "pcre2grep: Check your regex for nested unlimited loops.\n");
  }
exit(rc);
}